

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O2

word Shr_ManComputeTruth6_rec(Gia_Man_t *p,int iNode,Vec_Wrd_t *vTruths)

{
  int iVar1;
  word wVar2;
  Gia_Obj_t *pObj;
  word wVar3;
  ulong Entry;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iNode);
  if (iVar1 != 0) {
    wVar2 = Vec_WrdEntry(vTruths,iNode);
    return wVar2;
  }
  Gia_ObjSetTravIdCurrentId(p,iNode);
  pObj = Gia_ManObj(p,iNode);
  if ((-1 < (int)(uint)*(undefined8 *)pObj) &&
     (((uint)*(undefined8 *)pObj & 0x1fffffff) != 0x1fffffff)) {
    iVar1 = Gia_ObjFaninId0p(p,pObj);
    wVar2 = Shr_ManComputeTruth6_rec(p,iVar1,vTruths);
    iVar1 = Gia_ObjFaninId1p(p,pObj);
    wVar3 = Shr_ManComputeTruth6_rec(p,iVar1,vTruths);
    Entry = (wVar3 ^ (*(long *)pObj << 2) >> 0x3f) & ((*(long *)pObj << 0x22) >> 0x3f ^ wVar2);
    Vec_WrdWriteEntry(vTruths,iNode,Entry);
    return Entry;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaShrink6.c"
                ,0x145,"word Shr_ManComputeTruth6_rec(Gia_Man_t *, int, Vec_Wrd_t *)");
}

Assistant:

word Shr_ManComputeTruth6_rec( Gia_Man_t * p, int iNode, Vec_Wrd_t * vTruths )
{
    Gia_Obj_t * pObj;
    word Truth0, Truth1;
    if ( Gia_ObjIsTravIdCurrentId(p, iNode) )
        return Vec_WrdEntry(vTruths, iNode);
    Gia_ObjSetTravIdCurrentId(p, iNode);
    pObj = Gia_ManObj( p, iNode );
    assert( Gia_ObjIsAnd(pObj) );
    Truth0 = Shr_ManComputeTruth6_rec( p, Gia_ObjFaninId0p(p, pObj), vTruths );
    Truth1 = Shr_ManComputeTruth6_rec( p, Gia_ObjFaninId1p(p, pObj), vTruths );
    if ( Gia_ObjFaninC0(pObj) )
        Truth0 = ~Truth0;
    if ( Gia_ObjFaninC1(pObj) )
        Truth1 = ~Truth1;
    Vec_WrdWriteEntry( vTruths, iNode, Truth0 & Truth1 );
    return Truth0 & Truth1;
}